

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O3

char * __thiscall cmCPackIFWGenerator::GetPackagingInstallPrefix(cmCPackIFWGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_t sVar3;
  long *plVar4;
  char *pcVar5;
  long *plVar6;
  size_type *psVar7;
  string tmpPref;
  string local_a0;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60 [2];
  long local_50 [2];
  string local_40;
  
  pcVar2 = cmCPackGenerator::GetPackagingInstallPrefix(&this->super_cmCPackGenerator);
  pcVar5 = "";
  if (pcVar2 != (char *)0x0) {
    pcVar5 = pcVar2;
  }
  local_60[0] = local_50;
  sVar3 = strlen(pcVar5);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,pcVar5,pcVar5 + sVar3);
  if ((this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      0) {
    GetRootPackageName_abi_cxx11_(&local_40,this);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x5c25cf);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_70 = *plVar6;
      lStack_68 = plVar4[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar6;
      local_80 = (long *)*plVar4;
    }
    local_78 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_a0.field_2._M_allocated_capacity = *psVar7;
      local_a0.field_2._8_8_ = plVar4[3];
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar7;
      local_a0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_a0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_60,(ulong)local_a0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"CPACK_IFW_PACKAGING_INSTALL_PREFIX","");
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_a0,(char *)local_60[0]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"CPACK_IFW_PACKAGING_INSTALL_PREFIX","");
  pcVar5 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return pcVar5;
}

Assistant:

const char* cmCPackIFWGenerator::GetPackagingInstallPrefix()
{
  const char* defPrefix = this->cmCPackGenerator::GetPackagingInstallPrefix();

  std::string tmpPref = defPrefix ? defPrefix : "";

  if (this->Components.empty()) {
    tmpPref += "packages/" + this->GetRootPackageName() + "/data";
  }

  this->SetOption("CPACK_IFW_PACKAGING_INSTALL_PREFIX", tmpPref.c_str());

  return this->GetOption("CPACK_IFW_PACKAGING_INSTALL_PREFIX");
}